

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O2

void __thiscall ArithmeticBitModel::update(ArithmeticBitModel *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->bit_count + this->update_cycle;
  this->bit_count = uVar1;
  if (uVar1 < 0x2001) {
    uVar3 = this->bit_0_count;
  }
  else {
    uVar2 = uVar1 + 1 >> 1;
    this->bit_count = uVar2;
    uVar3 = this->bit_0_count + 1 >> 1;
    this->bit_0_count = uVar3;
    uVar1 = uVar2;
    if (uVar3 == uVar2) {
      uVar1 = uVar2 + 1;
      this->bit_count = uVar1;
      uVar3 = uVar2;
    }
  }
  this->bit_0_prob = (int)(0x80000000 / (ulong)uVar1) * uVar3 >> 0x12;
  uVar1 = this->update_cycle * 5;
  uVar3 = 0x40;
  if (uVar1 < 0x104) {
    uVar3 = uVar1 >> 2;
  }
  this->update_cycle = uVar3;
  this->bits_until_update = uVar3;
  return;
}

Assistant:

void ArithmeticBitModel::update()
{
  // halve counts when a threshold is reached
  if ((bit_count += update_cycle) > BM__MaxCount)
  {
    bit_count = (bit_count + 1) >> 1;
    bit_0_count = (bit_0_count + 1) >> 1;
    if (bit_0_count == bit_count) ++bit_count;
  }
  
  // compute scaled bit 0 probability
  U32 scale = 0x80000000U / bit_count;
  bit_0_prob = (bit_0_count * scale) >> (31 - BM__LengthShift);

  // set frequency of model updates
  update_cycle = (5 * update_cycle) >> 2;
  if (update_cycle > 64) update_cycle = 64;
  bits_until_update = update_cycle;
}